

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O2

void __thiscall SAUF<UFPC>::FirstScan(SAUF<UFPC> *this)

{
  uint uVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar4 = *(uint *)&pMVar2->field_0x8;
  uVar1 = *(uint *)&pMVar2->field_0xc;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  uVar10 = 0;
  *UFPC::P_ = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  uVar14 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar14 = uVar10;
  }
  UFPC::length_ = 1;
  lVar11 = -1;
  do {
    if (uVar10 == uVar14) {
      return;
    }
    pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar6 = *(long *)&pMVar2->field_0x10;
    lVar15 = **(long **)&pMVar2->field_0x48;
    lVar12 = lVar15 * uVar10 + lVar6;
    lVar9 = *(long *)&pMVar3->field_0x10;
    lVar13 = **(long **)&pMVar3->field_0x48;
    lVar7 = lVar13 * uVar10 + lVar9;
    lVar9 = lVar9 + lVar13 * lVar11;
    lVar6 = lVar6 + lVar15 * lVar11;
    lVar13 = 0;
    lVar15 = -1;
    while (lVar15 - uVar8 != -1) {
      if (*(char *)(lVar12 + 1 + lVar15) != '\0') {
        if (uVar10 == 0) {
          lVar5 = lVar15;
          if (lVar15 != -1) {
LAB_001b3f02:
            if (*(char *)(lVar12 + lVar5) != '\0') {
              uVar4 = *(uint *)(lVar7 + lVar5 * 4);
              goto LAB_001b3f5d;
            }
          }
LAB_001b3f4e:
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar4 = UFPC::length_;
          UFPC::length_ = UFPC::length_ + 1;
        }
        else if (*(char *)(lVar6 + 1 + lVar15) == '\0') {
          if ((lVar15 + 1 < (long)(int)uVar1 + -1) && (*(char *)(lVar6 + 2 + lVar15) != '\0')) {
            if (lVar15 == -1) {
LAB_001b3fc7:
              uVar4 = *(uint *)(lVar9 + 8 + lVar15 * 4);
            }
            else {
              if (*(char *)(lVar6 + lVar15) == '\0') {
                if (*(char *)(lVar12 + lVar15) == '\0') goto LAB_001b3fc7;
                uVar4 = *(uint *)(lVar7 + lVar15 * 4);
              }
              else {
                uVar4 = *(uint *)(lVar9 + lVar15 * 4);
              }
              uVar4 = UFPC::Merge(uVar4,*(uint *)(lVar9 + 8 + lVar15 * 4));
            }
          }
          else {
            if (lVar15 == -1) goto LAB_001b3f4e;
            if (*(char *)(lVar6 + lVar15) == '\0') {
              lVar5 = lVar13 + -1;
              goto LAB_001b3f02;
            }
            uVar4 = *(uint *)(lVar9 + lVar15 * 4);
          }
        }
        else {
          uVar4 = *(uint *)(lVar9 + 4 + lVar15 * 4);
        }
LAB_001b3f5d:
        *(uint *)(lVar7 + 4 + lVar15 * 4) = uVar4;
      }
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 1;
    }
    uVar10 = uVar10 + 1;
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void FirstScan() {

        const int h = img_.rows;
        const int w = img_.cols;

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }